

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrator.cpp
# Opt level: O2

Spectrum * __thiscall
phyr::SamplerIntegrator::specularReflect
          (Spectrum *__return_storage_ptr__,SamplerIntegrator *this,Ray *ray,
          SurfaceInteraction *isect,Scene *scene,Sampler *sampler,MemoryPool *pool,int depth)

{
  BSDF *this_00;
  double dVar1;
  bool bVar2;
  double pdf;
  Vector3f wi;
  Vector3f wo;
  Ray rd;
  Spectrum f;
  CoefficientSpectrum<60> local_5d0;
  CoefficientSpectrum<60> local_3f0;
  CoefficientSpectrum<60> local_210;
  
  wo.z = (isect->super_Interaction).wo.z;
  wo.x = (isect->super_Interaction).wo.x;
  wo.y = (isect->super_Interaction).wo.y;
  wi.z = 0.0;
  wi.x = 0.0;
  wi.y = 0.0;
  this_00 = isect->bsdf;
  (*sampler->_vptr_Sampler[5])(sampler);
  BSDF::sample_f(&f,this_00,&wo,&wi,(Point2f *)&local_5d0,&pdf,BSDF_SPECULAR|BSDF_REFLECTION,
                 (BxDFType *)0x0);
  if ((0.0 < pdf) &&
     (bVar2 = CoefficientSpectrum<60>::isBlack(&f.super_CoefficientSpectrum<60>), !bVar2)) {
    dVar1 = absDot<double>(&wi,&(isect->shadingGeom).n);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      Interaction::emitRay(&rd,&isect->super_Interaction,&wi);
      (*(this->super_Integrator)._vptr_Integrator[4])
                (&local_3f0,this,&rd,scene,sampler,pool,(ulong)(depth + 1));
      CoefficientSpectrum<60>::operator*(&local_210,&f.super_CoefficientSpectrum<60>,&local_3f0);
      dVar1 = absDot<double>(&wi,&(isect->shadingGeom).n);
      CoefficientSpectrum<60>::operator*(&local_5d0,&local_210,dVar1);
      CoefficientSpectrum<60>::operator/
                (&__return_storage_ptr__->super_CoefficientSpectrum<60>,&local_5d0,pdf);
      return __return_storage_ptr__;
    }
  }
  CoefficientSpectrum<60>::CoefficientSpectrum
            (&__return_storage_ptr__->super_CoefficientSpectrum<60>,0.0);
  return __return_storage_ptr__;
}

Assistant:

Spectrum SamplerIntegrator::specularReflect(const Ray& ray,
                                            const SurfaceInteraction& isect,
                                            const Scene& scene, Sampler& sampler,
                                            MemoryPool& pool, int depth) const {
    // Compute specular reflection direction _wi_ and BSDF value
    Vector3f wo = isect.wo, wi;
    Real pdf;
    BxDFType type = BxDFType(BSDF_REFLECTION | BSDF_SPECULAR);
    Spectrum f = isect.bsdf->sample_f(wo, &wi, sampler.getNextSample2D(), &pdf, type);

    // Return contribution of specular reflection
    const Normal3f &ns = isect.shadingGeom.n;
    if (pdf > 0.f && !f.isBlack() && absDot(wi, ns) != 0.f) {
        // Compute ray differential _rd_ for specular reflection
        Ray rd = isect.emitRay(wi);

// @todo: Uncomment once RayDifferentials are implemented
#if 0
        if (ray.hasDifferentials) {
            rd.hasDifferentials = true;
            rd.rxOrigin = isect.p + isect.dpdx;
            rd.ryOrigin = isect.p + isect.dpdy;
            // Compute differential reflected directions
            Normal3f dndx = isect.shading.dndu * isect.dudx +
                            isect.shading.dndv * isect.dvdx;
            Normal3f dndy = isect.shading.dndu * isect.dudy +
                            isect.shading.dndv * isect.dvdy;
            Vector3f dwodx = -ray.rxDirection - wo,
                     dwody = -ray.ryDirection - wo;
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            rd.rxDirection =
                wi - dwodx + 2.f * Vector3f(Dot(wo, ns) * dndx + dDNdx * ns);
            rd.ryDirection =
                wi - dwody + 2.f * Vector3f(Dot(wo, ns) * dndy + dDNdy * ns);
        }
#endif
        return f * li(rd, scene, sampler, pool, depth + 1) * absDot(wi, ns) / pdf;
    } else { return Spectrum(0.f); }
}